

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_cc79b7::DirectoryObject::DumpInstallers
          (Value *__return_storage_ptr__,DirectoryObject *this)

{
  bool bVar1;
  cmMakefile *this_00;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *this_01;
  pointer gen_00;
  undefined1 local_68 [8];
  Value installer;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *gen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range1;
  DirectoryObject *this_local;
  Value *installers;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  this_00 = cmLocalGenerator::GetMakefile(this->LG);
  this_01 = cmMakefile::GetInstallGenerators(this_00);
  __end1 = std::
           vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ::begin(this_01);
  gen = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
        std::
        vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
        ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                                     *)&gen), bVar1) {
    installer.limit_ =
         (ptrdiff_t)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
         ::operator*(&__end1);
    gen_00 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::get
                       ((unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        installer.limit_);
    DumpInstaller((Value *)local_68,this,gen_00);
    bVar1 = Json::Value::empty((Value *)local_68);
    if (!bVar1) {
      Json::Value::append(__return_storage_ptr__,(Value *)local_68);
    }
    Json::Value::~Value((Value *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstallers()
{
  Json::Value installers = Json::arrayValue;
  for (const auto& gen : this->LG->GetMakefile()->GetInstallGenerators()) {
    Json::Value installer = this->DumpInstaller(gen.get());
    if (!installer.empty()) {
      installers.append(std::move(installer)); // NOLINT(*)
    }
  }
  return installers;
}